

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImplicitParam.hpp
# Opt level: O2

void __thiscall
rc::detail::ImplicitParam<rc::detail::param::CurrentPropertyContext>::ImplicitParam
          (ImplicitParam<rc::detail::param::CurrentPropertyContext> *this,ValueType value)

{
  pair<rc::detail::PropertyContext_*,_unsigned_long> local_10;
  
  local_10.second = (DAT_001a9bb0 - ImplicitScope::m_scopes) / 0x18;
  local_10.first = value;
  std::
  vector<std::pair<rc::detail::PropertyContext*,unsigned_long>,std::allocator<std::pair<rc::detail::PropertyContext*,unsigned_long>>>
  ::emplace_back<std::pair<rc::detail::PropertyContext*,unsigned_long>>
            ((vector<std::pair<rc::detail::PropertyContext*,unsigned_long>,std::allocator<std::pair<rc::detail::PropertyContext*,unsigned_long>>>
              *)m_stack,&local_10);
  return;
}

Assistant:

ImplicitParam<Param>::ImplicitParam(ValueType value) {
  m_stack.push(
      std::make_pair(std::move(value), ImplicitScope::m_scopes.size()));
}